

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O1

void __thiscall QWindowSystemInterfacePrivate::MouseEvent::~MouseEvent(MouseEvent *this)

{
  Data *pDVar1;
  
  (this->super_PointerEvent).super_InputEvent.super_UserEvent.super_WindowSystemEvent.
  _vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007e5280;
  pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (pDVar1 = (this->super_PointerEvent).super_InputEvent.super_UserEvent.window.wp.d,
       pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

MouseEvent(QWindow *w, ulong time, const QPointF &local, const QPointF &global,
                   Qt::MouseButtons state, Qt::KeyboardModifiers mods,
                   Qt::MouseButton b, QEvent::Type type,
                   Qt::MouseEventSource src = Qt::MouseEventNotSynthesized, bool frame = false,
                   const QPointingDevice *device = QPointingDevice::primaryPointingDevice(),
                   int evPtId = -1)
            : PointerEvent(w, time, Mouse, mods, device), localPos(local), globalPos(global),
              buttons(state), source(src), nonClientArea(frame), button(b), buttonType(type),
              eventPointId(evPtId) { }